

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex.h
# Opt level: O1

bool __thiscall
Gudhi::cubical_complex::
is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
::operator()(is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
             *this,Simplex_handle *sh1,Simplex_handle *sh2)

{
  double dVar1;
  double dVar2;
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
  *pBVar3;
  ulong uVar4;
  pointer pdVar5;
  ulong uVar6;
  pointer puVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  
  pBVar3 = this->CC_;
  uVar4 = *sh1;
  pdVar5 = (pBVar3->super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>).
           super_Bitmap_cubical_complex_base<double>.data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar1 = pdVar5[uVar4];
  uVar6 = *sh2;
  dVar2 = pdVar5[uVar6];
  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
    puVar7 = (pBVar3->super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>).
             super_Bitmap_cubical_complex_base<double>.multipliers.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = (long)(pBVar3->super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>).
                   super_Bitmap_cubical_complex_base<double>.multipliers.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar7 >> 2;
    iVar14 = 0;
    iVar16 = 0;
    uVar12 = uVar4;
    if (1 < uVar15) {
      iVar16 = 0;
      uVar13 = uVar15;
      do {
        uVar8 = uVar12 / puVar7[uVar13 - 1];
        uVar12 = uVar12 % (ulong)puVar7[uVar13 - 1];
        uVar13 = uVar13 - 1;
        iVar16 = iVar16 + ((uint)uVar8 & 1);
      } while (1 < uVar13);
    }
    uVar10 = ((uint)uVar12 & 1) + iVar16;
    uVar12 = uVar6;
    if (1 < uVar15) {
      iVar14 = 0;
      do {
        uVar13 = uVar12 / puVar7[uVar15 - 1];
        uVar12 = uVar12 % (ulong)puVar7[uVar15 - 1];
        uVar15 = uVar15 - 1;
        iVar14 = iVar14 + ((uint)uVar13 & 1);
      } while (1 < uVar15);
    }
    uVar11 = ((uint)uVar12 & 1) + iVar14;
    bVar9 = uVar10 < uVar11;
    if (uVar10 == uVar11) {
      bVar9 = uVar4 < uVar6;
    }
    return bVar9;
  }
  return dVar1 < dVar2;
}

Assistant:

bool operator()(const typename Bitmap_cubical_complex<T>::Simplex_handle& sh1,
                  const typename Bitmap_cubical_complex<T>::Simplex_handle& sh2) const {
    // Not using st_->filtration(sh1) because it uselessly tests for null_simplex.
    typedef typename T::filtration_type Filtration_value;
    Filtration_value fil1 = CC_->data[sh1];
    Filtration_value fil2 = CC_->data[sh2];
    if (fil1 != fil2) {
      return fil1 < fil2;
    }
    // in this case they are on the same filtration level, so the dimension decide.
    std::size_t dim1 = CC_->get_dimension_of_a_cell(sh1);
    std::size_t dim2 = CC_->get_dimension_of_a_cell(sh2);
    if (dim1 != dim2) {
      return dim1 < dim2;
    }
    // in this case both filtration and dimensions of the considered cubes are the same. To have stable sort, we simply
    // compare their positions in the bitmap:
    return sh1 < sh2;
  }